

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t matchstr(char *str,size_t slen,char *fmt,...)

{
  void **m;
  char cVar1;
  char in_AL;
  parse_status_t pVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined1 local_78 [8];
  va_list arg_list;
  membuffer buf;
  scanner_t scanner;
  char save_char;
  parse_status_t ret_code;
  char *fmt_local;
  size_t slen_local;
  char *str_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  cVar1 = str[slen];
  str[slen] = '\0';
  m = &arg_list[0].reg_save_area;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  membuffer_init((membuffer *)m);
  membuffer_attach((membuffer *)m,str,slen);
  scanner_init((scanner_t *)&buf.size_inc,(membuffer *)m);
  arg_list[0].overflow_arg_area = local_128;
  arg_list[0]._0_8_ = &stack0x00000008;
  local_78._4_4_ = 0x30;
  local_78._0_4_ = 0x18;
  pVar2 = vfmatch((scanner_t *)&buf.size_inc,fmt,(__va_list_tag *)local_78);
  str[slen] = cVar1;
  return pVar2;
}

Assistant:

parse_status_t matchstr(char *str, size_t slen, const char *fmt, ...)
{
	parse_status_t ret_code;
	char save_char;
	scanner_t scanner;
	membuffer buf;
	va_list arg_list;

	/* null terminate str */
	save_char = str[slen];
	str[slen] = '\0';

	membuffer_init(&buf);

	/* under no circumstances should this buffer be modifed because its
	 * memory */
	/*  might have not come from malloc() */
	membuffer_attach(&buf, str, slen);

	scanner_init(&scanner, &buf);
	scanner.entire_msg_loaded = 1;

	va_start(arg_list, fmt);
	ret_code = vfmatch(&scanner, fmt, arg_list);
	va_end(arg_list);

	/* restore str */
	str[slen] = save_char;

	/* don't destroy buf */

	return ret_code;
}